

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O3

Vec_Flt_t * Abc_NtkTestCreateArrivals(int nInputs)

{
  Vec_Flt_t *pVVar1;
  float *__ptr;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t __size;
  
  pVVar1 = (Vec_Flt_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nInputs - 1U) {
    iVar3 = nInputs;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    __ptr = (float *)0x0;
  }
  else {
    __ptr = (float *)malloc((long)iVar3 << 2);
  }
  pVVar1->pArray = __ptr;
  if (0 < nInputs) {
    __size = 0;
    iVar2 = 0;
    uVar4 = 0;
    do {
      if ((int)uVar4 == iVar3) {
        if (uVar4 < 0x10) {
          if (__ptr == (float *)0x0) {
            __ptr = (float *)malloc(0x40);
          }
          else {
            __ptr = (float *)realloc(__ptr,0x40);
          }
          pVVar1->pArray = __ptr;
          iVar3 = 0x10;
        }
        else {
          if (__ptr == (float *)0x0) {
            __ptr = (float *)malloc(__size);
          }
          else {
            __ptr = (float *)realloc(__ptr,__size);
          }
          pVVar1->pArray = __ptr;
          iVar3 = iVar2;
        }
      }
      __ptr[uVar4] = (float)((int)uVar4 + (int)((uVar4 & 0xffffffff) / 10) * -10);
      uVar4 = uVar4 + 1;
      iVar2 = iVar2 + 2;
      __size = __size + 8;
    } while (nInputs != (int)uVar4);
    pVVar1->nSize = (int)uVar4;
    pVVar1->nCap = iVar3;
  }
  return pVVar1;
}

Assistant:

Vec_Flt_t * Abc_NtkTestCreateArrivals( int nInputs )
{
    Vec_Flt_t * p;
    int i;
    p = Vec_FltAlloc( nInputs );
    for ( i = 0; i < nInputs; i++ )
        Vec_FltPush( p, 1.0*(i % 10) );
    return p;
}